

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void emitLoop(int loopStart)

{
  Chunk *pCVar1;
  int in_EDI;
  int offset;
  
  emitByte('\0');
  pCVar1 = currentChunk();
  if (0xffff < (pCVar1->count - in_EDI) + 2) {
    error((char *)0x107c25);
  }
  emitByte('\0');
  emitByte('\0');
  return;
}

Assistant:

static void emitLoop(int loopStart) {
    emitByte(OP_LOOP);

    int offset = currentChunk()->count - loopStart + 2;
    if (offset > UINT16_MAX) error("Loop body too large.");

    emitByte((offset >> 8) & 0xff);
    emitByte(offset & 0xff);
}